

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O3

void __thiscall
btMatrix3x3::diagonalize(btMatrix3x3 *this,btMatrix3x3 *rot,btScalar threshold,int maxSteps)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  rot->m_el[0].m_floats[0] = 1.0;
  rot->m_el[0].m_floats[1] = 0.0;
  rot->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)(rot->m_el[0].m_floats + 3) = 0;
  rot->m_el[1].m_floats[1] = 1.0;
  rot->m_el[1].m_floats[2] = 0.0;
  rot->m_el[1].m_floats[3] = 0.0;
  rot->m_el[2].m_floats[0] = 0.0;
  rot->m_el[2].m_floats[1] = 0.0;
  *(long *)(rot->m_el[2].m_floats + 2) = SUB168(ZEXT416(0x3f800000),0);
  if (0 < maxSteps) {
    do {
      fVar10 = ABS(this->m_el[0].m_floats[1]);
      fVar14 = ABS(this->m_el[0].m_floats[2]);
      fVar13 = fVar14;
      if (fVar14 <= fVar10) {
        fVar13 = fVar10;
      }
      fVar9 = ABS(this->m_el[1].m_floats[2]);
      bVar1 = fVar9 <= fVar13;
      if (bVar1) {
        iVar6 = 2 - (uint)(fVar10 < fVar14);
        iVar2 = (fVar10 < fVar14) + 1;
      }
      else {
        iVar2 = 2;
        iVar6 = 0;
        fVar13 = fVar9;
      }
      bVar1 = !bVar1;
      fVar10 = (ABS(this->m_el[2].m_floats[2]) +
               ABS(this->m_el[1].m_floats[1]) + ABS(this->m_el[0].m_floats[0])) * threshold;
      if ((fVar13 <= fVar10) && (maxSteps = 1, fVar13 <= fVar10 * 1.1920929e-07)) {
        return;
      }
      fVar13 = *(float *)((long)this->m_el[bVar1].m_floats + (ulong)(uint)(iVar2 * 4));
      uVar8 = iVar2 << 4;
      fVar10 = *(float *)((long)this->m_el[0].m_floats + (ulong)(uint)(iVar2 * 4) + (ulong)uVar8);
      fVar14 = this->m_el[bVar1].m_floats[bVar1];
      fVar9 = (fVar10 - fVar14) / (fVar13 + fVar13);
      fVar11 = fVar9 * fVar9;
      if (8.388608e+07 <= fVar11 * fVar11) {
        fVar11 = 1.0 / (fVar9 * (0.5 / fVar11 + 2.0));
        fVar9 = fVar11 * -0.5 * fVar11 + 1.0;
      }
      else {
        fVar11 = 1.0 / ((float)((uint)-SQRT(fVar11 + 1.0) & -(uint)(fVar9 < 0.0) |
                               ~-(uint)(fVar9 < 0.0) & (uint)SQRT(fVar11 + 1.0)) + fVar9);
        fVar9 = 1.0 / SQRT(fVar11 * fVar11 + 1.0);
      }
      fVar12 = fVar11 * fVar9;
      lVar5 = (ulong)bVar1 * 4;
      *(undefined4 *)((long)this->m_el[0].m_floats + lVar5 + (ulong)uVar8) = 0;
      uVar3 = (ulong)(uint)(iVar2 << 2);
      *(undefined4 *)((long)this->m_el[bVar1].m_floats + uVar3) = 0;
      this->m_el[bVar1].m_floats[bVar1] = fVar14 - fVar11 * fVar13;
      *(float *)((long)this->m_el[0].m_floats + uVar3 + uVar8) = fVar11 * fVar13 + fVar10;
      uVar4 = iVar6 << 4;
      fVar13 = *(float *)((long)this->m_el[0].m_floats + lVar5 + (ulong)uVar4);
      fVar10 = *(float *)((long)this->m_el[0].m_floats + uVar3 + uVar4);
      fVar14 = fVar9 * fVar13 - fVar10 * fVar12;
      *(float *)((long)this->m_el[bVar1].m_floats + (ulong)(uint)(iVar6 << 2)) = fVar14;
      *(float *)((long)this->m_el[0].m_floats + lVar5 + (ulong)uVar4) = fVar14;
      fVar13 = fVar13 * fVar12 + fVar9 * fVar10;
      *(float *)((long)this->m_el[0].m_floats + (ulong)(uint)(iVar6 << 2) + (ulong)uVar8) = fVar13;
      *(float *)((long)this->m_el[0].m_floats + uVar3 + uVar4) = fVar13;
      lVar7 = 0;
      do {
        fVar13 = *(float *)((long)rot->m_el[0].m_floats + lVar7 + lVar5);
        fVar10 = *(float *)((long)rot->m_el[0].m_floats + lVar7 + uVar3);
        *(float *)((long)rot->m_el[0].m_floats + lVar7 + lVar5) = fVar9 * fVar13 + fVar10 * -fVar12;
        *(float *)((long)rot->m_el[0].m_floats + lVar7 + uVar3) = fVar10 * fVar9 + fVar13 * fVar12;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x30);
      bVar1 = 1 < maxSteps;
      maxSteps = maxSteps + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void diagonalize(btMatrix3x3& rot, btScalar threshold, int maxSteps)
	{
		rot.setIdentity();
		for (int step = maxSteps; step > 0; step--)
		{
			// find off-diagonal element [p][q] with largest magnitude
			int p = 0;
			int q = 1;
			int r = 2;
			btScalar max = btFabs(m_el[0][1]);
			btScalar v = btFabs(m_el[0][2]);
			if (v > max)
			{
				q = 2;
				r = 1;
				max = v;
			}
			v = btFabs(m_el[1][2]);
			if (v > max)
			{
				p = 1;
				q = 2;
				r = 0;
				max = v;
			}

			btScalar t = threshold * (btFabs(m_el[0][0]) + btFabs(m_el[1][1]) + btFabs(m_el[2][2]));
			if (max <= t)
			{
				if (max <= SIMD_EPSILON * t)
				{
					return;
				}
				step = 1;
			}

			// compute Jacobi rotation J which leads to a zero for element [p][q] 
			btScalar mpq = m_el[p][q];
			btScalar theta = (m_el[q][q] - m_el[p][p]) / (2 * mpq);
			btScalar theta2 = theta * theta;
			btScalar cos;
			btScalar sin;
			if (theta2 * theta2 < btScalar(10 / SIMD_EPSILON))
			{
				t = (theta >= 0) ? 1 / (theta + btSqrt(1 + theta2))
					: 1 / (theta - btSqrt(1 + theta2));
				cos = 1 / btSqrt(1 + t * t);
				sin = cos * t;
			}
			else
			{
				// approximation for large theta-value, i.e., a nearly diagonal matrix
				t = 1 / (theta * (2 + btScalar(0.5) / theta2));
				cos = 1 - btScalar(0.5) * t * t;
				sin = cos * t;
			}

			// apply rotation to matrix (this = J^T * this * J)
			m_el[p][q] = m_el[q][p] = 0;
			m_el[p][p] -= t * mpq;
			m_el[q][q] += t * mpq;
			btScalar mrp = m_el[r][p];
			btScalar mrq = m_el[r][q];
			m_el[r][p] = m_el[p][r] = cos * mrp - sin * mrq;
			m_el[r][q] = m_el[q][r] = cos * mrq + sin * mrp;

			// apply rotation to rot (rot = rot * J)
			for (int i = 0; i < 3; i++)
			{
				btVector3& row = rot[i];
				mrp = row[p];
				mrq = row[q];
				row[p] = cos * mrp - sin * mrq;
				row[q] = cos * mrq + sin * mrp;
			}
		}
	}